

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve_algorithms.cpp
# Opt level: O3

void __thiscall
Clasp::SolveAlgorithm::start
          (SolveAlgorithm *this,SharedContext *ctx,LitVec *assume,ModelHandler *onModel)

{
  bool bVar1;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *this_00;
  
  bVar1 = attach(this,ctx,onModel);
  if (bVar1) {
    this_00 = (pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)operator_new(0x10);
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pod_vector(this_00,assume);
    SingleOwnerPtr<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
    ::reset(&this->path_,this_00);
    (*this->_vptr_SolveAlgorithm[7])(this,ctx,(this->path_).ptr_ & 0xfffffffffffffffe);
    return;
  }
  return;
}

Assistant:

void SolveAlgorithm::start(SharedContext& ctx, const LitVec& assume, ModelHandler* onModel) {
	if (attach(ctx, onModel)) {
		doStart(ctx, *(path_ = new LitVec(assume)));
	}
}